

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteLock.cpp
# Opt level: O3

void __thiscall ReadWriteLock::unlock(ReadWriteLock *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = this->mCount;
  if (0 < iVar1) {
    if (iVar1 == 1) {
      this->mCount = 0;
      this->mWrite = false;
      std::condition_variable::notify_all();
    }
    else {
      this->mCount = iVar1 + -1;
      if (this->mWrite == true) {
        __assert_fail("!mWrite",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/ReadWriteLock.cpp"
                      ,0x33,"void ReadWriteLock::unlock()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  __assert_fail("mCount > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/ReadWriteLock.cpp"
                ,0x30,"void ReadWriteLock::unlock()");
}

Assistant:

void ReadWriteLock::unlock()
{
    std::lock_guard<std::mutex> locker(mMutex);
    assert(mCount > 0);
    if (mCount > 1) {
        --mCount;
        assert(!mWrite);
        return;
    }
    --mCount;
    assert(!mCount);
    mWrite = false;
    mCond.notify_all();
}